

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O3

void option_toggle_menu(char *name,wchar_t page)

{
  menu_conflict *menu;
  long lVar1;
  
  menu = menu_new(MN_SKIN_SCROLL,&option_toggle_iter);
  menu->prompt = "Set option (y/n/t), select with movement keys or index";
  menu->cmd_keys = "YyNnTt";
  menu->selections = "abcdefgimopquvwzABCDEFGHIJKLMOPQUVWZ";
  menu->flags = 0x10;
  if ((page == L'\0') || (page == L'\v')) {
    menu->prompt = "Set option (y/n/t), \'s\' to save, \'r\' to restore, \'x\' to reset";
    menu->cmd_keys = "YyNnTtSsRrXx";
    menu->context_hook = use_option_context_menu;
    if (page == L'\v') {
      page = L'\x01';
    }
  }
  else if (page == L'\x01') {
    menu->prompt = "You can only modify these options at character birth.";
    menu->cmd_keys = "";
    menu->flags = 2;
    page = L'\x01';
  }
  menu->title = name;
  lVar1 = 0;
  do {
    if (option_page[page][lVar1] == 0) goto LAB_001fac5a;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x15);
  lVar1 = 0x15;
LAB_001fac5a:
  menu_setpriv(menu,0x2c,&player->opts);
  menu_set_filter(menu,option_page[page],(int)lVar1);
  menu_layout(menu,&SCREEN_REGION);
  screen_save();
  clear_from(L'\0');
  menu_select(menu,0,false);
  screen_load();
  mem_free(menu);
  return;
}

Assistant:

static void option_toggle_menu(const char *name, int page)
{
	static const char selections[] = "abcdefgimopquvwzABCDEFGHIJKLMOPQUVWZ";
	int i;
	
	struct menu *m = menu_new(MN_SKIN_SCROLL, &option_toggle_iter);

	/* for all menus */
	m->prompt = "Set option (y/n/t), select with movement keys or index";
	m->cmd_keys = "YyNnTt";
	m->selections = selections;
	m->flags = MN_DBL_TAP;

	/* We add 10 onto the page amount to indicate we're at birth */
	if (page == OPT_PAGE_BIRTH) {
		m->prompt = "You can only modify these options at character birth.";
		m->cmd_keys = "";
		m->flags = MN_NO_TAGS;
	} else if (page == OPT_PAGE_BIRTH + 10 || page == OP_INTERFACE) {
		m->prompt = "Set option (y/n/t), 's' to save, 'r' to restore, 'x' to reset";
		m->cmd_keys = "YyNnTtSsRrXx";
		/* Provide a context menu for equivalents to 's', 'r', .... */
		m->context_hook = use_option_context_menu;
		if (page == OPT_PAGE_BIRTH + 10) {
			page -= 10;
		}
	}

	/* for this particular menu */
	m->title = name;

	/* Find the number of valid entries */
	for (i = 0; i < OPT_PAGE_PER; i++) {
		if (option_page[page][i] == OPT_none)
			break;
	}

	/* Set the data to the player's options */
	menu_setpriv(m, OPT_MAX, &player->opts.opt);
	menu_set_filter(m, option_page[page], i);
	menu_layout(m, &SCREEN_REGION);

	/* Run the menu */
	screen_save();

	clear_from(0);
	menu_select(m, 0, false);

	screen_load();

	mem_free(m);
}